

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

void DecodeCommandBlockSwitch(BrotliDecoderStateInternal *s)

{
  size_t *psVar1;
  ushort uVar2;
  ushort uVar3;
  long *plVar4;
  uint *puVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  HuffmanCode *pHVar12;
  HuffmanCode *pHVar13;
  
  pHVar13 = s->block_type_trees;
  uVar7 = (s->br).bit_pos_;
  uVar10 = (s->br).val_;
  if (0x2f < uVar7) {
    (s->br).val_ = uVar10 >> 0x30;
    uVar7 = uVar7 ^ 0x30;
    (s->br).bit_pos_ = uVar7;
    plVar4 = (long *)(s->br).next_in;
    uVar10 = uVar10 >> 0x30 | *plVar4 << 0x10;
    (s->br).val_ = uVar10;
    psVar1 = &(s->br).avail_in;
    *psVar1 = *psVar1 - 6;
    (s->br).next_in = (uint8_t *)((long)plVar4 + 6);
  }
  uVar11 = uVar10 >> ((byte)uVar7 & 0x3f);
  pHVar13 = pHVar13 + (uVar11 & 0xff) + 0x278;
  bVar6 = pHVar13->bits;
  if (8 < bVar6) {
    uVar7 = uVar7 + 8;
    pHVar13 = pHVar13 + (ulong)pHVar13->value +
                        (ulong)((uint)(uVar11 >> 8) & 0xffffff & kBitMask[bVar6 - 8]);
    bVar6 = pHVar13->bits;
  }
  pHVar12 = s->block_len_trees;
  uVar7 = bVar6 + uVar7;
  uVar2 = pHVar13->value;
  if (0x2f < uVar7) {
    (s->br).val_ = uVar10 >> 0x30;
    plVar4 = (long *)(s->br).next_in;
    uVar10 = uVar10 >> 0x30 | *plVar4 << 0x10;
    (s->br).val_ = uVar10;
    psVar1 = &(s->br).avail_in;
    *psVar1 = *psVar1 - 6;
    uVar7 = uVar7 ^ 0x30;
    (s->br).next_in = (uint8_t *)((long)plVar4 + 6);
  }
  uVar11 = uVar10 >> ((byte)uVar7 & 0x3f);
  pHVar12 = pHVar12 + (uVar11 & 0xff) + 0x18c;
  uVar8 = (uint)pHVar12->bits;
  if (8 < uVar8) {
    uVar7 = uVar7 + 8;
    pHVar12 = pHVar12 + (ulong)pHVar12->value +
                        (ulong)((uint)(uVar11 >> 8) & 0xffffff & kBitMask[pHVar12->bits - 8]);
    uVar8 = (uint)pHVar12->bits;
  }
  uVar8 = uVar8 + uVar7;
  bVar6 = kBlockLengthPrefixCode[pHVar12->value].nbits;
  uVar3 = kBlockLengthPrefixCode[pHVar12->value].offset;
  if (0x1f < uVar8) {
    uVar8 = uVar8 ^ 0x20;
    (s->br).bit_pos_ = uVar8;
    puVar5 = (uint *)(s->br).next_in;
    uVar10 = uVar10 >> 0x20 | (ulong)*puVar5 << 0x20;
    (s->br).val_ = uVar10;
    psVar1 = &(s->br).avail_in;
    *psVar1 = *psVar1 - 4;
    (s->br).next_in = (uint8_t *)(puVar5 + 1);
  }
  uVar7 = s->num_block_types[1];
  uVar9 = kBitMask[(uint)bVar6];
  (s->br).bit_pos_ = uVar8 + bVar6;
  s->block_length[1] = ((uint)(uVar10 >> ((byte)uVar8 & 0x3f)) & uVar9) + (uint)uVar3;
  if (uVar2 == 0) {
    uVar8 = s->block_type_rb[2];
  }
  else if (uVar2 == 1) {
    uVar8 = s->block_type_rb[3] + 1;
  }
  else {
    uVar8 = uVar2 - 2;
  }
  uVar9 = 0;
  if (uVar7 <= uVar8) {
    uVar9 = uVar7;
  }
  s->block_type_rb[2] = s->block_type_rb[3];
  s->block_type_rb[3] = uVar8 - uVar9;
  s->htree_command = (s->insert_copy_hgroup).htrees[uVar8 - uVar9];
  return;
}

Assistant:

static void BROTLI_NOINLINE DecodeCommandBlockSwitch(BrotliDecoderState* s) {
  DecodeCommandBlockSwitchInternal(0, s);
}